

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.hpp
# Opt level: O2

string * duckdb::CreateRelationAlias(string *__return_storage_ptr__,RelationType type,string *alias)

{
  idx_t length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30 [32];
  
  if (alias->_M_string_length == 0) {
    ::std::__cxx11::string::string(local_30,"%s_%s",&local_71);
    EnumUtil::ToString<duckdb::RelationType>(&local_50,type);
    StringUtil::GenerateRandomName_abi_cxx11_(&local_70,(StringUtil *)0x10,length);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_30,&local_50,&local_70,in_R8);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string(local_30);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)alias);
  }
  return __return_storage_ptr__;
}

Assistant:

static string CreateRelationAlias(RelationType type, const string &alias) {
	if (!alias.empty()) {
		return alias;
	}
	return StringUtil::Format("%s_%s", EnumUtil::ToString(type), StringUtil::GenerateRandomName());
}